

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

void __thiscall QTextStreamPrivate::~QTextStreamPrivate(QTextStreamPrivate *this)

{
  Data *pDVar1;
  
  if ((this->deleteDevice == true) && (this->device != (QIODevice *)0x0)) {
    (*this->device->_vptr_QIODevice[1])();
  }
  QLocale::~QLocale(&this->locale);
  pDVar1 = (this->readBuffer).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->readBuffer).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->writeBuffer).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->writeBuffer).d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringConverter::State::clear(&(this->savedToUtf16).super_QStringConverter.state);
  QStringConverter::State::clear(&(this->toUtf16).super_QStringConverter.state);
  QStringConverter::State::clear(&(this->fromUtf16).super_QStringConverter.state);
  return;
}

Assistant:

QTextStreamPrivate::~QTextStreamPrivate()
{
    if (deleteDevice) {
#ifndef QT_NO_QOBJECT
        device->blockSignals(true);
#endif
        delete device;
    }
}